

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderApiTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::get_uniform_location(NegativeTestContext *ctx)

{
  RenderContext *renderCtx;
  GLuint program_00;
  GLuint program_01;
  GLuint program_02;
  ShaderProgram program;
  allocator<char> local_202;
  allocator<char> local_201;
  string local_200;
  string local_1e0;
  ProgramSources local_1c0;
  ShaderProgram local_f0;
  
  program_00 = glu::CallLogWrapper::glCreateProgram(&ctx->super_CallLogWrapper);
  program_01 = glu::CallLogWrapper::glCreateShader(&ctx->super_CallLogWrapper,0x8b31);
  renderCtx = ctx->m_renderCtx;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_200,
             "#version 300 es\nvoid main (void)\n{\n\tgl_Position = vec4(0.0);\n}\n",&local_201);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e0,
             "#version 300 es\nlayout(location = 0) out mediump vec4 fragColor;void main (void)\n{\n\tfragColor = vec4(0.0);\n}\n"
             ,&local_202);
  glu::makeVtxFragSources(&local_1c0,&local_200,&local_1e0);
  glu::ShaderProgram::ShaderProgram(&local_f0,renderCtx,&local_1c0);
  glu::ProgramSources::~ProgramSources(&local_1c0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_200);
  program_02 = glu::CallLogWrapper::glCreateProgram(&ctx->super_CallLogWrapper);
  glu::CallLogWrapper::glDeleteProgram(&ctx->super_CallLogWrapper,program_02);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c0,
             "GL_INVALID_OPERATION is generated if program has not been successfully linked.",
             (allocator<char> *)&local_200);
  NegativeTestContext::beginSection(ctx,(string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  glu::CallLogWrapper::glGetUniformLocation(&ctx->super_CallLogWrapper,program_00,"test");
  NegativeTestContext::expectError(ctx,0x502);
  NegativeTestContext::endSection(ctx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c0,
             "GL_INVALID_VALUE is generated if program is not a value generated by OpenGL.",
             (allocator<char> *)&local_200);
  NegativeTestContext::beginSection(ctx,(string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  glu::CallLogWrapper::glUseProgram(&ctx->super_CallLogWrapper,local_f0.m_program.m_program);
  glu::CallLogWrapper::glGetUniformLocation(&ctx->super_CallLogWrapper,program_02,"test");
  NegativeTestContext::expectError(ctx,0x501);
  NegativeTestContext::endSection(ctx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c0,
             "GL_INVALID_OPERATION is generated if program is not a program object.",
             (allocator<char> *)&local_200);
  NegativeTestContext::beginSection(ctx,(string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  glu::CallLogWrapper::glGetAttribLocation(&ctx->super_CallLogWrapper,program_01,"test");
  NegativeTestContext::expectError(ctx,0x502);
  NegativeTestContext::endSection(ctx);
  glu::CallLogWrapper::glUseProgram(&ctx->super_CallLogWrapper,0);
  glu::CallLogWrapper::glDeleteProgram(&ctx->super_CallLogWrapper,program_00);
  glu::CallLogWrapper::glDeleteShader(&ctx->super_CallLogWrapper,program_01);
  glu::ShaderProgram::~ShaderProgram(&local_f0);
  return;
}

Assistant:

void get_uniform_location (NegativeTestContext& ctx)
{
	GLuint programEmpty = ctx.glCreateProgram();
	GLuint shader = ctx.glCreateShader(GL_VERTEX_SHADER);

	glu::ShaderProgram program(ctx.getRenderContext(), glu::makeVtxFragSources(vertexShaderSource, fragmentShaderSource));

	const GLuint notAProgram = ctx.glCreateProgram();
	ctx.glDeleteProgram(notAProgram);

	ctx.beginSection("GL_INVALID_OPERATION is generated if program has not been successfully linked.");
	ctx.glGetUniformLocation(programEmpty, "test");
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if program is not a value generated by OpenGL.");
	ctx.glUseProgram(program.getProgram());
	ctx.glGetUniformLocation(notAProgram, "test");
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if program is not a program object.");
	ctx.glGetAttribLocation(shader, "test");
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.glUseProgram(0);
	ctx.glDeleteProgram(programEmpty);
	ctx.glDeleteShader(shader);
}